

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O3

char * Diligent::Parsing::SkipLine<char_const*>(char **Start,char **End,bool GoToNextLine)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar3 = (byte *)*Start;
  pbVar2 = (byte *)*End;
  if (pbVar3 != pbVar2) {
    while( true ) {
      pbVar4 = pbVar3 + 1;
      bVar1 = *pbVar3;
      if ((bVar1 < 0xe) && ((0x2401U >> (bVar1 & 0x1f) & 1) != 0)) break;
      pbVar3 = pbVar4;
      if (pbVar4 == pbVar2) {
        return (char *)pbVar2;
      }
    }
    if ((GoToNextLine) && ((bVar1 == 10 || (bVar1 == 0xd)))) {
      if (pbVar4 == pbVar2 || bVar1 != 0xd) {
        return (char *)pbVar4;
      }
      pbVar3 = pbVar3 + 2;
      if (*pbVar4 != 10) {
        pbVar3 = pbVar4;
      }
    }
  }
  return (char *)pbVar3;
}

Assistant:

InteratorType SkipLine(const InteratorType& Start, const InteratorType& End, bool GoToNextLine = false) noexcept
{
    auto Pos = Start;
    while (Pos != End && *Pos != '\0' && !IsNewLine(*Pos))
        ++Pos;
    if (GoToNextLine && Pos != End && IsNewLine(*Pos))
    {
        ++Pos;
        if (Pos[-1] == '\r' && Pos != End && Pos[0] == '\n')
        {
            ++Pos;
            // treat \r\n as a single ending
        }
    }
    return Pos;
}